

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O2

bool __thiscall
ODDLParser::OpenDDLExport::writeValueType
          (OpenDDLExport *this,ValueType type,size_t numItems,string *statement)

{
  char *__s;
  string typeStr;
  char buffer [256];
  string asStack_148 [32];
  allocator<char> local_128 [264];
  
  if (type != ddl_types_max) {
    __s = getTypeToken(type);
    std::__cxx11::string::string<std::allocator<char>>(asStack_148,__s,local_128);
    std::__cxx11::string::append((string *)statement);
    if (1 < numItems) {
      std::__cxx11::string::append((char *)statement);
      memset(local_128,0,0x100);
      snprintf((char *)local_128,0x100,"%d",numItems & 0xffffffff);
      std::__cxx11::string::append((char *)statement);
      std::__cxx11::string::append((char *)statement);
    }
    std::__cxx11::string::~string(asStack_148);
  }
  return type != ddl_types_max;
}

Assistant:

bool OpenDDLExport::writeValueType(Value::ValueType type, size_t numItems, std::string &statement) {
    if (Value::ValueType::ddl_types_max == type) {
        return false;
    }

    const std::string typeStr(getTypeToken(type));
    statement += typeStr;
    // if we have an array to write
    if (numItems > 1) {
        statement += "[";
        char buffer[256];
        ::memset(buffer, '\0', 256 * sizeof(char));
        snprintf(buffer, sizeof(buffer), "%d", static_cast<int>(numItems));
        statement += buffer;
        statement += "]";
    }

    return true;
}